

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall punky::par::Parser::Parser(Parser *this,Lexer *lex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unordered_map<punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>,_std::hash<punky::tok::TokenType>,_std::equal_to<punky::tok::TokenType>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>_>
  *this_00;
  unordered_map<punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>,_std::hash<punky::tok::TokenType>,_std::equal_to<punky::tok::TokenType>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>_>
  *this_01;
  pointer pcVar3;
  undefined8 uVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  key_type local_284 [5];
  _Any_data local_270;
  code *local_260;
  code *local_258;
  _Any_data local_250;
  code *local_240;
  code *local_238;
  _Any_data local_230;
  code *local_220;
  code *local_218;
  _Any_data local_210;
  code *local_200;
  code *local_1f8;
  _Any_data local_1f0;
  code *local_1e0;
  code *local_1d8;
  _Any_data local_1d0;
  code *local_1c0;
  code *local_1b8;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  _Any_data local_190;
  code *local_180;
  code *local_178;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  paVar1 = &(this->m_lex).m_line.field_2;
  (this->m_lex).m_line._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (lex->m_line)._M_dataplus._M_p;
  paVar2 = &(lex->m_line).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(lex->m_line).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_lex).m_line.field_2 + 8) = uVar4;
  }
  else {
    (this->m_lex).m_line._M_dataplus._M_p = pcVar3;
    (this->m_lex).m_line.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_lex).m_line._M_string_length = (lex->m_line)._M_string_length;
  (lex->m_line)._M_dataplus._M_p = (pointer)paVar2;
  (lex->m_line)._M_string_length = 0;
  (lex->m_line).field_2._M_local_buf[0] = '\0';
  (this->m_lex).m_curr_char = lex->m_curr_char;
  (this->m_lex).m_curr_it._M_current = (lex->m_curr_it)._M_current;
  (this->m_curr_tok).m_type = LeftParen;
  (this->m_curr_tok).m_literal.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->m_peek_tok).m_type = LeftParen;
  (this->m_peek_tok).m_literal.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->m_prefix_parse_fns;
  (this->m_prefix_parse_fns)._M_h._M_buckets = &(this->m_prefix_parse_fns)._M_h._M_single_bucket;
  (this->m_prefix_parse_fns)._M_h._M_bucket_count = 1;
  (this->m_prefix_parse_fns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_prefix_parse_fns)._M_h._M_element_count = 0;
  (this->m_prefix_parse_fns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_prefix_parse_fns)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_prefix_parse_fns)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = &this->m_infix_parse_fns;
  (this->m_infix_parse_fns)._M_h._M_buckets = &(this->m_infix_parse_fns)._M_h._M_single_bucket;
  (this->m_infix_parse_fns)._M_h._M_bucket_count = 1;
  (this->m_infix_parse_fns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_infix_parse_fns)._M_h._M_element_count = 0;
  (this->m_infix_parse_fns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_infix_parse_fns)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_infix_parse_fns)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  consume(this);
  consume(this);
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:27:44)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:27:44)>
             ::_M_manager;
  local_284[0] = Identifier;
  local_f0._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_f0);
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,__destroy_functor);
  }
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:28:37)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:28:37)>
              ::_M_manager;
  local_284[0] = Int;
  local_110._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_110);
  if (local_100 != (code *)0x0) {
    (*local_100)(&local_110,&local_110,__destroy_functor);
  }
  local_130._8_8_ = 0;
  local_118 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:29:38)>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:29:38)>
              ::_M_manager;
  local_284[0] = Bang;
  local_130._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_130);
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,__destroy_functor);
  }
  local_150._8_8_ = 0;
  local_138 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:30:39)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:30:39)>
              ::_M_manager;
  local_284[0] = Minus;
  local_150._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_150);
  if (local_140 != (code *)0x0) {
    (*local_140)(&local_150,&local_150,__destroy_functor);
  }
  local_170._8_8_ = 0;
  local_158 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:31:38)>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:31:38)>
              ::_M_manager;
  local_284[0] = True;
  local_170._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,__destroy_functor);
  }
  local_190._8_8_ = 0;
  local_178 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:32:39)>
              ::_M_invoke;
  local_180 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:32:39)>
              ::_M_manager;
  local_284[0] = False;
  local_190._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_190);
  if (local_180 != (code *)0x0) {
    (*local_180)(&local_190,&local_190,__destroy_functor);
  }
  local_1b0._8_8_ = 0;
  local_198 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:33:43)>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:33:43)>
              ::_M_manager;
  local_284[0] = LeftParen;
  local_1b0._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_1b0);
  if (local_1a0 != (code *)0x0) {
    (*local_1a0)(&local_1b0,&local_1b0,__destroy_functor);
  }
  local_1d0._8_8_ = 0;
  local_1b8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:34:36)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:34:36)>
              ::_M_manager;
  local_284[0] = If;
  local_1d0._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_1d0);
  if (local_1c0 != (code *)0x0) {
    (*local_1c0)(&local_1d0,&local_1d0,__destroy_functor);
  }
  local_1f0._8_8_ = 0;
  local_1d8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:35:38)>
              ::_M_invoke;
  local_1e0 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:35:38)>
              ::_M_manager;
  local_284[0] = Func;
  local_1f0._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_1f0);
  if (local_1e0 != (code *)0x0) {
    (*local_1e0)(&local_1f0,&local_1f0,__destroy_functor);
  }
  local_210._8_8_ = 0;
  local_1f8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:37:37)>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:37:37)>
              ::_M_manager;
  local_284[0] = Plus;
  local_210._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_210);
  if (local_200 != (code *)0x0) {
    (*local_200)(&local_210,&local_210,__destroy_functor);
  }
  local_230._8_8_ = 0;
  local_218 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:40:38)>
              ::_M_invoke;
  local_220 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:40:38)>
              ::_M_manager;
  local_284[0] = Minus;
  local_230._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_230);
  if (local_220 != (code *)0x0) {
    (*local_220)(&local_230,&local_230,__destroy_functor);
  }
  local_250._8_8_ = 0;
  local_238 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:43:41)>
              ::_M_invoke;
  local_240 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:43:41)>
              ::_M_manager;
  local_284[0] = Asterisk;
  local_250._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_250);
  if (local_240 != (code *)0x0) {
    (*local_240)(&local_250,&local_250,__destroy_functor);
  }
  local_270._8_8_ = 0;
  local_258 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:46:38)>
              ::_M_invoke;
  local_260 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:46:38)>
              ::_M_manager;
  local_284[0] = Slash;
  local_270._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_270);
  if (local_260 != (code *)0x0) {
    (*local_260)(&local_270,&local_270,__destroy_functor);
  }
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:49:43)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:49:43)>
             ::_M_manager;
  local_284[0] = EqualEqual;
  local_50._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:52:42)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:52:42)>
             ::_M_manager;
  local_284[0] = BangEqual;
  local_70._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:55:37)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:55:37)>
             ::_M_manager;
  local_284[0] = Less;
  local_90._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:58:40)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:58:40)>
             ::_M_manager;
  local_284[0] = Greater;
  local_b0._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_b0);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:61:42)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:61:42)>
             ::_M_manager;
  local_284[0] = LeftParen;
  local_d0._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_d0);
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  return;
}

Assistant:

Parser::Parser(Lexer lex) :
  m_lex{std::move(lex)}
{
    consume();
    consume();

    register_prefix(TokenType::Identifier, [this] { return parse_identifier(); });
    register_prefix(TokenType::Int, [this] { return parse_int_literal(); });
    register_prefix(TokenType::Bang, [this] { return parse_prefix_expression(); });
    register_prefix(TokenType::Minus, [this] { return parse_prefix_expression(); });
    register_prefix(TokenType::True, [this] { return parse_boolean(); });
    register_prefix(TokenType::False, [this] { return parse_boolean(); });
    register_prefix(TokenType::LeftParen, [this] { return parse_grouped_expression(); });
    register_prefix(TokenType::If, [this] { return parse_if_expression(); });
    register_prefix(TokenType::Func, [this] { return parse_function_literal(); });

    register_infix(TokenType::Plus, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Minus, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Asterisk, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Slash, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::EqualEqual, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::BangEqual, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Less, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Greater, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::LeftParen, [this](ast::ExprNodePtr function) {
        return parse_call_expression(std::move(function));
    });
}